

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_regex.c
# Opt level: O1

char * ngx_regex_pcre_jit(ngx_conf_t *cf,void *post,void *data)

{
  ngx_flag_t *fp;
  
  if (*data != 0) {
    ngx_conf_log_error(5,cf,0,"nginx was built without PCRE JIT support");
    *(undefined8 *)data = 0;
  }
  return (char *)0x0;
}

Assistant:

static char *
ngx_regex_pcre_jit(ngx_conf_t *cf, void *post, void *data)
{
    ngx_flag_t  *fp = data;

    if (*fp == 0) {
        return NGX_CONF_OK;
    }

#if (NGX_HAVE_PCRE_JIT)
    {
    int  jit, r;

    jit = 0;
    r = pcre_config(PCRE_CONFIG_JIT, &jit);

    if (r != 0 || jit != 1) {
        ngx_conf_log_error(NGX_LOG_WARN, cf, 0,
                           "PCRE library does not support JIT");
        *fp = 0;
    }
    }
#else
    ngx_conf_log_error(NGX_LOG_WARN, cf, 0,
                       "nginx was built without PCRE JIT support");
    *fp = 0;
#endif

    return NGX_CONF_OK;
}